

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O3

double double_conversion::RadixStringToIeee<4,char_const*>
                 (char **current,char *end,bool sign,uc16 separator,bool parse_as_hex_float,
                 bool allow_trailing_junk,double junk_string_value,bool read_as_double,
                 bool *result_is_junk)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  undefined7 extraout_var;
  byte *pbVar6;
  char *pcVar7;
  double dVar8;
  char cVar9;
  byte bVar10;
  ulong uVar11;
  char **end_00;
  uint uVar12;
  undefined7 in_register_00000011;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  byte bVar13;
  undefined4 uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  undefined3 in_register_00000089;
  int iVar18;
  uint uVar19;
  Double *this;
  DiyFp diy_fp;
  char *local_78;
  undefined4 local_70;
  undefined4 local_6c;
  char *local_68;
  ulong local_60;
  double local_58;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  local_6c = CONCAT31(in_register_00000089,allow_trailing_junk);
  *result_is_junk = true;
  local_78 = end;
  local_68 = end;
  local_58 = junk_string_value;
  do {
    pcVar7 = *current;
    cVar9 = *pcVar7;
    if (cVar9 != '0') {
      local_70 = (undefined4)CONCAT71(in_register_00000011,sign);
      uVar15 = 0x18;
      if (read_as_double) {
        uVar15 = 0x35;
      }
      local_60 = 0;
      uVar19 = 0;
      this = (Double *)0x0;
      goto LAB_0087b0af;
    }
    bVar3 = Advance<char_const*>(current,separator,0x10,&local_78);
  } while (!bVar3);
  *result_is_junk = false;
  if (sign) {
LAB_0087b406:
    dVar8 = -0.0;
  }
  else {
    dVar8 = 0.0;
  }
  return dVar8;
LAB_0087b0af:
  uVar12 = (uint)cVar9;
  uVar5 = (ulong)uVar12;
  uVar16 = uVar12 - 0x30;
  if (9 < uVar16) {
    if ((byte)(cVar9 + 0x9fU) < 6) {
      uVar16 = uVar12 - 0x57;
      goto LAB_0087b0d6;
    }
    if ((byte)(cVar9 + 0xbfU) < 6) {
      uVar16 = uVar12 - 0x37;
      goto LAB_0087b0d6;
    }
    if (!parse_as_hex_float) {
LAB_0087b41d:
      if (pcVar7 != local_68 && (char)local_6c == '\0') {
        do {
          uVar5 = CONCAT71((int7)(uVar5 >> 8),*pcVar7);
          lVar17 = 0;
          while ((&kWhitespaceTable7)[lVar17] != *pcVar7) {
            lVar17 = lVar17 + 1;
            if (lVar17 == 6) {
              return local_58;
            }
          }
          pcVar7 = pcVar7 + 1;
          *current = pcVar7;
        } while (pcVar7 != local_68);
      }
      goto LAB_0087b309;
    }
    if (cVar9 != '.') {
      if ((cVar9 != 'P') && (cVar9 != 'p')) goto LAB_0087b41d;
      *result_is_junk = false;
      goto LAB_0087b322;
    }
    Advance<char_const*>(current,separator,0x10,&local_78);
    local_60 = CONCAT71(extraout_var,1);
LAB_0087b119:
    pcVar7 = *current;
    cVar9 = *pcVar7;
    goto LAB_0087b0af;
  }
LAB_0087b0d6:
  uVar12 = uVar19 - 4;
  if ((local_60 & 1) == 0) {
    uVar12 = uVar19;
  }
  this = (Double *)((ulong)uVar16 + (long)this * 0x10);
  uVar5 = (long)this >> (sbyte)uVar15;
  if ((int)uVar5 == 0) {
    bVar3 = Advance<char_const*>(current,separator,0x10,&local_78);
    uVar5 = extraout_RDX;
    uVar19 = uVar12;
    if (!bVar3) goto LAB_0087b119;
    goto LAB_0087b309;
  }
  iVar18 = 1;
  if (1 < (int)uVar5) {
    uVar11 = uVar5 & 0xffffffff;
    do {
      iVar18 = iVar18 + 1;
      uVar11 = uVar11 >> 1;
      uVar19 = (uint)uVar5;
      uVar5 = uVar11;
    } while (3 < uVar19);
  }
  bVar10 = (byte)iVar18;
  local_44 = -1 << (bVar10 & 0x1f);
  local_40 = (long)this >> (bVar10 & 0x3f);
  local_38 = uVar15;
  bVar3 = Advance<char_const*>(current,separator,0x10,&local_78);
  bVar13 = 1;
  iVar18 = uVar12 + iVar18;
  uVar5 = extraout_RDX_00;
  while (!bVar3) {
    pbVar6 = (byte *)*current;
    if (parse_as_hex_float) {
      bVar4 = *pbVar6;
      if (bVar4 == 0x2e) {
        end_00 = &local_78;
        Advance<char_const*>(current,separator,0x10,end_00);
        pbVar6 = (byte *)*current;
        local_60 = CONCAT71((int7)((ulong)end_00 >> 8),1);
        goto LAB_0087b1ef;
      }
    }
    else {
LAB_0087b1ef:
      bVar4 = *pbVar6;
    }
    uVar19 = (int)(char)bVar4 - 0x30;
    uVar5 = (ulong)CONCAT31((int3)(uVar19 >> 8),uVar19 < 10);
    if (('?' < (char)bVar4 || uVar19 >= 10) &&
       ((0x25 < bVar4 - 0x41 ||
        (uVar5 = 0x3f0000003f, (0x3f0000003fU >> ((ulong)(bVar4 - 0x41) & 0x3f) & 1) == 0)))) break;
    bVar13 = bVar13 & bVar4 == 0x30;
    iVar1 = iVar18 + 4;
    if ((local_60 & 1) != 0) {
      iVar1 = iVar18;
    }
    bVar3 = Advance<char_const*>(current,separator,0x10,&local_78);
    iVar18 = iVar1;
    uVar5 = extraout_RDX_01;
  }
  if ((char)local_6c == '\0' && !parse_as_hex_float) {
    pcVar7 = *current;
    while (pcVar7 != local_68) {
      uVar5 = CONCAT71((int7)(uVar5 >> 8),*pcVar7);
      lVar17 = 0;
      while ((&kWhitespaceTable7)[lVar17] != *pcVar7) {
        lVar17 = lVar17 + 1;
        if (lVar17 == 6) {
          return local_58;
        }
      }
      pcVar7 = pcVar7 + 1;
      *current = pcVar7;
    }
  }
  uVar12 = (uint)this & ~local_44;
  uVar19 = 1 << (bVar10 - 1 & 0x1f);
  if ((int)uVar19 < (int)uVar12) {
    uVar15 = local_40 + 1;
  }
  else {
    uVar15 = local_40;
    if (uVar12 == uVar19) {
      uVar15 = local_40 + ((byte)(~bVar13 | (byte)local_40) & 1);
    }
  }
  bVar3 = (uVar15 >> (local_38 & 0x3f) & 1) != 0;
  this = (Double *)((long)uVar15 >> bVar3);
  uVar19 = iVar18 + (uint)bVar3;
LAB_0087b309:
  *result_is_junk = false;
  if (parse_as_hex_float) {
LAB_0087b322:
    Advance<char_const*>(current,separator,0x10,&local_78);
    uVar14 = 0;
    if (**current == '+') {
LAB_0087b34c:
      Advance<char_const*>(current,separator,0x10,&local_78);
    }
    else if (**current == '-') {
      uVar14 = 1;
      goto LAB_0087b34c;
    }
    local_58 = (double)CONCAT44(local_58._4_4_,uVar14);
    uVar12 = 0;
    do {
      uVar16 = (int)**current - 0x30;
      uVar5 = (ulong)uVar16;
      if (9 < uVar16) break;
      uVar16 = -uVar12;
      if (0 < (int)uVar12) {
        uVar16 = uVar12;
      }
      uVar2 = **current + -0x30 + uVar12 * 10;
      if (0x17bb0 < uVar16) {
        uVar2 = uVar12;
      }
      uVar12 = uVar2;
      bVar3 = Advance<char_const*>(current,separator,0x10,&local_78);
      uVar5 = extraout_RDX_02;
    } while (!bVar3);
    uVar16 = -uVar12;
    if (local_58._0_1_ == '\0') {
      uVar16 = uVar12;
    }
    uVar19 = uVar16 + uVar19;
  }
  if ((uVar19 != 0) && (this != (Double *)0x0)) {
    diy_fp.f_ = (ulong)uVar19;
    diy_fp._8_8_ = uVar5;
    dVar8 = (double)Double::DiyFpToUint64(this,diy_fp);
    if ((char)local_70 == '\0') {
      return dVar8;
    }
    return (double)((ulong)dVar8 ^ (ulong)DAT_00c4a990);
  }
  if ((char)local_70 == '\0') {
LAB_0087b3fc:
    return (double)(long)this;
  }
  if (this != (Double *)0x0) {
    this = (Double *)-(long)this;
    goto LAB_0087b3fc;
  }
  goto LAB_0087b406;
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                uc16 separator,
                                bool parse_as_hex_float,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  DOUBLE_CONVERSION_ASSERT(*current != end);
  DOUBLE_CONVERSION_ASSERT(!parse_as_hex_float ||
      IsHexFloatString(*current, end, separator, allow_trailing_junk));

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);
  // Whether we have encountered a '.' and are parsing the decimal digits.
  // Only relevant if parse_as_hex_float is true.
  bool post_decimal = false;

  // Skip leading 0s.
  while (**current == '0') {
    if (Advance(current, separator, radix, end)) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  while (true) {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (parse_as_hex_float && **current == '.') {
      post_decimal = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
      continue;
    } else if (parse_as_hex_float && (**current == 'p' || **current == 'P')) {
      break;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent += overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        if (Advance(current, separator, radix, end)) break;
        if (parse_as_hex_float && **current == '.') {
          // Just run over the '.'. We are just trying to see whether there is
          // a non-zero digit somewhere.
          Advance(current, separator, radix, end);
          DOUBLE_CONVERSION_ASSERT(*current != end);
          post_decimal = true;
        }
        if (!isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        if (!post_decimal) exponent += radix_log_2;
      }

      if (!parse_as_hex_float &&
          !allow_trailing_junk &&
          AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    if (Advance(current, separator, radix, end)) break;
  }

  DOUBLE_CONVERSION_ASSERT(number < ((int64_t)1 << kSignificandSize));
  DOUBLE_CONVERSION_ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (parse_as_hex_float) {
    DOUBLE_CONVERSION_ASSERT(**current == 'p' || **current == 'P');
    Advance(current, separator, radix, end);
    DOUBLE_CONVERSION_ASSERT(*current != end);
    bool is_negative = false;
    if (**current == '+') {
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    } else if (**current == '-') {
      is_negative = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    }
    int written_exponent = 0;
    while (IsDecimalDigitForRadix(**current, 10)) {
      // No need to read exponents if they are too big. That could potentially overflow
      // the `written_exponent` variable.
      if (abs(written_exponent) <= 100 * Double::kMaxExponent) {
        written_exponent = 10 * written_exponent + **current - '0';
      }
      if (Advance(current, separator, radix, end)) break;
    }
    if (is_negative) written_exponent = -written_exponent;
    exponent += written_exponent;
  }

  if (exponent == 0 || number == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  DOUBLE_CONVERSION_ASSERT(number != 0);
  double result = Double(DiyFp(number, exponent)).value();
  return sign ? -result : result;
}